

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringStream.hpp
# Opt level: O0

String<char> __thiscall Qentem::StringStream<char>::GetString(StringStream<char> *this)

{
  SizeT SVar1;
  SizeT SVar2;
  char *pcVar3;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar4;
  StringStream<char> *in_RSI;
  String<char> SVar5;
  SizeT len;
  StringStream<char> *this_local;
  String<char> *str;
  
  SVar1 = Capacity(in_RSI);
  SVar2 = Length(in_RSI);
  if (SVar2 < SVar1) {
    SVar1 = Length(in_RSI);
    pcVar3 = Storage(in_RSI);
    SVar2 = Length(in_RSI);
    pcVar3[SVar2] = '\0';
    pcVar3 = Detach(in_RSI);
    String<char>::String((String<char> *)this,pcVar3,SVar1);
    uVar4 = extraout_RDX;
  }
  else {
    pcVar3 = First(in_RSI);
    SVar1 = Length(in_RSI);
    String<char>::String((String<char> *)this,pcVar3,SVar1);
    Reset(in_RSI);
    uVar4 = extraout_RDX_00;
  }
  SVar5._8_8_ = uVar4;
  SVar5.storage_ = (char *)this;
  return SVar5;
}

Assistant:

String<Char_T> GetString() {
        if (Capacity() > Length()) {
            const SizeT len     = Length();
            Storage()[Length()] = Char_T{0};
            return String<Char_T>(Detach(), len);
        }

        String<Char_T> str{First(), Length()};

        Reset();

        return str;
    }